

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dashel-common.cpp
# Opt level: O0

void __thiscall Dashel::IPV4Address::IPV4Address(IPV4Address *this,string *name,unsigned_short port)

{
  int iVar1;
  uint32_t uVar2;
  char *pcVar3;
  in_addr local_2c;
  hostent *phStack_28;
  in_addr addr;
  hostent *he;
  unsigned_short port_local;
  string *name_local;
  IPV4Address *this_local;
  
  this->port = port;
  pcVar3 = (char *)std::__cxx11::string::c_str();
  phStack_28 = gethostbyname(pcVar3);
  if (phStack_28 == (hostent *)0x0) {
    pcVar3 = (char *)std::__cxx11::string::c_str();
    iVar1 = inet_aton(pcVar3,&local_2c);
    if (iVar1 == 0) {
      this->address = 0;
    }
    else {
      uVar2 = ntohl(local_2c.s_addr);
      this->address = uVar2;
    }
  }
  else {
    uVar2 = ntohl(*(uint32_t *)*phStack_28->h_addr_list);
    this->address = uVar2;
  }
  return;
}

Assistant:

IPV4Address::IPV4Address(const std::string& name, unsigned short port) :
		port(port)
	{
		hostent* he = gethostbyname(name.c_str());

		if (he == NULL)
		{
#ifndef WIN32
			struct in_addr addr;
			if (inet_aton(name.c_str(), &addr))
			{
				address = ntohl(addr.s_addr);
			}
			else
			{
				address = INADDR_ANY;
			}
#else // WIN32
			unsigned long addr = inet_addr(name.c_str());
			if (addr != INADDR_NONE)
				address = addr;
			else
				address = INADDR_ANY;
#endif // WIN32
		}
		else
		{
#ifndef WIN32
			address = ntohl(*((unsigned*)he->h_addr));
#else
			address = ntohl(*((unsigned*)he->h_addr));
#endif
		}
	}